

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int i;
  int iVar1;
  ImGuiTabBar *pIVar2;
  
  i = this->FreeIdx;
  if (i == (this->Data).Size) {
    ImVector<ImGuiTabBar>::resize(&this->Data,i + 1);
    iVar1 = this->FreeIdx + 1;
  }
  else {
    pIVar2 = ImVector<ImGuiTabBar>::operator[](&this->Data,i);
    iVar1 = (pIVar2->Tabs).Size;
  }
  this->FreeIdx = iVar1;
  pIVar2 = ImVector<ImGuiTabBar>::operator[](&this->Data,i);
  ImGuiTabBar::ImGuiTabBar(pIVar2);
  pIVar2 = ImVector<ImGuiTabBar>::operator[](&this->Data,i);
  return pIVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Data.Size) { Data.resize(Data.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Data[idx]; } IM_PLACEMENT_NEW(&Data[idx]) T(); return &Data[idx]; }